

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

string * mp::internal::
         OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::Parse(char **s,bool splitString)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  byte in_DL;
  long *in_RSI;
  string *in_RDI;
  char *start;
  char *in_stack_ffffffffffffff70;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  byte local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  local_20 = (char *)*in_RSI;
  local_10 = in_RSI;
  if (local_11 == 0) {
    bVar1 = quoted((char *)*in_RSI);
    if (bVar1) {
      pcVar5 = SkipToMatchingQuote((char *)*local_10);
      *local_10 = (long)pcVar5;
      pcVar5 = local_20 + 1;
      lVar4 = *local_10 - (long)local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar5,lVar4 - 2,local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    else {
      pcVar5 = SkipNonSpaces(in_stack_ffffffffffffff70);
      *local_10 = (long)pcVar5;
      uVar3 = *local_10 - (long)local_20;
      pcVar5 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar5,uVar3,&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
    }
  }
  else {
    pcVar2 = SkipToEnd((char *)*in_RSI);
    pcVar5 = local_20;
    *local_10 = (long)pcVar2;
    uVar3 = *local_10 - (long)local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar5,uVar3,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string OptionHelper<std::string>::Parse(const char *&s, bool splitString) {
  const char *start = s;
  if (splitString) // if the string has been already split (by the command line parser)
  {                // @todo consider quotes here too?
    s = SkipToEnd(s);
    return std::string(start, s - start);
  }
  if (quoted(s))
  {
    s = SkipToMatchingQuote(s);
    return std::string(start + 1, s - start - 2);
  }
  {
    s = SkipNonSpaces(s);
    return std::string(start, s - start);
  }
}